

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::MediumInterface
          (FormattingScene *this,string *insideName,string *outsideName,FileLoc loc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  string local_38 [12];
  int in_stack_ffffffffffffffd4;
  FormattingScene *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  indent_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (in_RSI,in_RDX,in_stack_ffffffffffffffe0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void FormattingScene::MediumInterface(const std::string &insideName,
                                      const std::string &outsideName, FileLoc loc) {
    Printf("%sMediumInterface \"%s\" \"%s\"\n", indent(), insideName, outsideName);
}